

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

bool (anonymous_namespace)::readWaveform<float,float>
               (ifstream *fin,TWaveformT<float> *res,int32_t offset,streamsize size)

{
  float *pfVar1;
  int in_EDX;
  char *in_RDI;
  vector<float,_std::allocator<float>_> *unaff_retaddr;
  
  std::vector<float,_std::allocator<float>_>::resize(unaff_retaddr,(size_type)in_RDI);
  pfVar1 = std::vector<float,_std::allocator<float>_>::data
                     ((vector<float,_std::allocator<float>_> *)0x1b85e5);
  std::istream::read(in_RDI,(long)(pfVar1 + in_EDX));
  return true;
}

Assistant:

bool readWaveform(std::ifstream & fin, TWaveformT<TSample> & res, int32_t offset, std::streamsize size) {
        if (std::is_same<TSample, TSampleI16>::value) {
            std::vector<TSampleInput> buf(size/sizeof(TSampleInput));
            res.resize(offset + size/sizeof(TSampleInput));
            fin.read((char *)(buf.data()), size);
            double amax = calcAbsMax(buf);
            double iamax = amax != 0.0 ? 1.0/amax : 1.0;
            for (auto i = 0; i < (int) buf.size(); ++i) res[offset + i] = std::round(std::numeric_limits<TSampleI16>::max()*(buf[i]*iamax));
        } else if (std::is_same<TSample, TSampleF>::value) {
            res.resize(offset + size/sizeof(TSample));
            fin.read((char *)(res.data() + offset), size);
        } else {
            return false;
        }
        return true;
    }